

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell-interface.h
# Opt level: O2

Literal * __thiscall
wasm::ShellExternalInterface::tableLoad
          (Literal *__return_storage_ptr__,ShellExternalInterface *this,Name tableName,Address index
          )

{
  iterator iVar1;
  long lVar2;
  long lVar3;
  undefined1 local_38 [8];
  Name tableName_local;
  
  tableName_local.super_IString.str._M_len = tableName.super_IString.str._M_str;
  local_38 = tableName.super_IString.str._M_len;
  iVar1 = std::
          _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->tables)._M_h,(key_type *)local_38);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_wasm::Name,_std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    (*(this->super_ExternalInterface)._vptr_ExternalInterface[8])
              (this,"tableGet on non-existing table");
  }
  lVar3 = *(long *)((long)iVar1.
                          super__Node_iterator_base<std::pair<const_wasm::Name,_std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>_>,_true>
                          ._M_cur + 0x18);
  lVar2 = *(long *)((long)iVar1.
                          super__Node_iterator_base<std::pair<const_wasm::Name,_std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>_>,_true>
                          ._M_cur + 0x20) - lVar3;
  if ((ulong)(lVar2 / 0x18) <= index.addr) {
    (*(this->super_ExternalInterface)._vptr_ExternalInterface[8])
              (this,"out of bounds table access",lVar2 % 0x18);
    lVar3 = *(long *)((long)iVar1.
                            super__Node_iterator_base<std::pair<const_wasm::Name,_std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>_>,_true>
                            ._M_cur + 0x18);
  }
  wasm::Literal::Literal(__return_storage_ptr__,(Literal *)(index.addr * 0x18 + lVar3));
  return __return_storage_ptr__;
}

Assistant:

Literal tableLoad(Name tableName, Address index) override {
    auto it = tables.find(tableName);
    if (it == tables.end()) {
      trap("tableGet on non-existing table");
    }

    auto& table = it->second;
    if (index >= table.size()) {
      trap("out of bounds table access");
    }

    return table[index];
  }